

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_program_query
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  deUint32 dVar2;
  RenderContext *pRVar3;
  mapped_type *this;
  ProgramSources *pPVar4;
  InternalError *pIVar5;
  char *local_640;
  allocator<char> local_629;
  string local_628;
  TestLog *local_608;
  TestLog *log_1;
  undefined1 local_530 [8];
  ShaderProgram graphicsPipelineProgram;
  string local_458;
  StringTemplate local_438;
  string local_418;
  undefined1 local_3f8 [8];
  FragmentSource fragSource;
  string local_3c8;
  StringTemplate local_3a8;
  string local_388;
  undefined1 local_368 [8];
  VertexSource vertSource;
  string local_338;
  allocator<char> local_311;
  string local_310;
  TestLog *local_2f0;
  TestLog *log;
  undefined1 local_218 [8];
  ShaderProgram invalidComputeProgram;
  string local_140;
  StringTemplate local_120;
  string local_100;
  undefined1 local_e0 [8];
  ComputeSource compSource;
  string local_b0;
  GLint local_90 [2];
  GLint data [3];
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  if (bVar1) {
    local_640 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_640 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(data + 2),"GLSL_VERSION_STRING",(allocator<char> *)((long)data + 7));
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_50,(key_type *)(data + 2));
  std::__cxx11::string::operator=((string *)this,local_640);
  std::__cxx11::string::~string((string *)(data + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)data + 7));
  data[0] = 0;
  local_90[0] = 0;
  local_90[1] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Compute shader that does not link",
             (allocator<char> *)(compSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  NegativeTestContext::beginSection(ctx,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(compSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,
             "${GLSL_VERSION_STRING}\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nvoid main (void)\n{\n\thighp uint var = -1;\n}\n"
             ,(allocator<char> *)((long)&invalidComputeProgram.m_program.m_info.linkTimeUs + 7));
  tcu::StringTemplate::StringTemplate(&local_120,&local_140);
  tcu::StringTemplate::specialize
            (&local_100,&local_120,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  tcu::StringTemplate::~StringTemplate(&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&invalidComputeProgram.m_program.m_info.linkTimeUs + 7));
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources((ProgramSources *)&log);
  pPVar4 = glu::ProgramSources::operator<<((ProgramSources *)&log,(ShaderSource *)local_e0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_218,pRVar3,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&log);
  local_2f0 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<(local_2f0,(ShaderProgram *)local_218);
  bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_218);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,
               "GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly."
               ,&local_311);
    NegativeTestContext::beginSection(ctx,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_218);
    glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,dVar2,0x8267,local_90);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_218);
    glu::ComputeSource::~ComputeSource((ComputeSource *)local_e0);
    NegativeTestContext::endSection(ctx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"Compute shader not present",
               (allocator<char> *)(vertSource.super_ShaderSource.source.field_2._M_local_buf + 0xf))
    ;
    NegativeTestContext::beginSection(ctx,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator
              ((allocator<char> *)(vertSource.super_ShaderSource.source.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,
               "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
               (allocator<char> *)(fragSource.super_ShaderSource.source.field_2._M_local_buf + 0xf))
    ;
    tcu::StringTemplate::StringTemplate(&local_3a8,&local_3c8);
    tcu::StringTemplate::specialize
              (&local_388,&local_3a8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50);
    glu::VertexSource::VertexSource((VertexSource *)local_368,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    tcu::StringTemplate::~StringTemplate(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(fragSource.super_ShaderSource.source.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,
               "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
               ,(allocator<char> *)((long)&graphicsPipelineProgram.m_program.m_info.linkTimeUs + 7))
    ;
    tcu::StringTemplate::StringTemplate(&local_438,&local_458);
    tcu::StringTemplate::specialize
              (&local_418,&local_438,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_3f8,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    tcu::StringTemplate::~StringTemplate(&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&graphicsPipelineProgram.m_program.m_info.linkTimeUs + 7));
    pRVar3 = NegativeTestContext::getRenderContext(ctx);
    glu::ProgramSources::ProgramSources((ProgramSources *)&log_1);
    pPVar4 = glu::ProgramSources::operator<<((ProgramSources *)&log_1,(ShaderSource *)local_368);
    pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_3f8);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_530,pRVar3,pPVar4);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&log_1);
    local_608 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
    glu::operator<<(local_608,(ShaderProgram *)local_530);
    bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_530);
    if (!bVar1) {
      pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar5,"failed to build program",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeComputeTests.cpp"
                 ,0x1e2);
      __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_628,
               "GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly."
               ,&local_629);
    NegativeTestContext::beginSection(ctx,&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_530);
    glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,dVar2,0x8267,local_90);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_530);
    glu::FragmentSource::~FragmentSource((FragmentSource *)local_3f8);
    glu::VertexSource::~VertexSource((VertexSource *)local_368);
    NegativeTestContext::endSection(ctx);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
    return;
  }
  pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar5,"program should not of built",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeComputeTests.cpp"
             ,0x1cd);
  __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void invalid_program_query (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	GLint data[3] = { 0, 0, 0 };

	ctx.beginSection("Compute shader that does not link");
	{
		const glu::ComputeSource	compSource(tcu::StringTemplate(invalidComputeShaderSource).specialize(args));
		glu::ShaderProgram			invalidComputeProgram (ctx.getRenderContext(), glu::ProgramSources() << compSource);

		tcu::TestLog& log = ctx.getLog();
		log << invalidComputeProgram;

		if (invalidComputeProgram.isOk())
			TCU_THROW(InternalError, "program should not of built");

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly.");
		ctx.glGetProgramiv(invalidComputeProgram.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, &data[0]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glUseProgram(0);
	}
	ctx.endSection();

	ctx.beginSection("Compute shader not present");
	{
		const glu::VertexSource		vertSource(tcu::StringTemplate(vertexShaderSource).specialize(args));
		const glu::FragmentSource	fragSource(tcu::StringTemplate(fragmentShaderSource).specialize(args));
		glu::ShaderProgram			graphicsPipelineProgram	(ctx.getRenderContext(), glu::ProgramSources() << vertSource << fragSource);

		tcu::TestLog& log = ctx.getLog();
		log << graphicsPipelineProgram;

		if (!graphicsPipelineProgram.isOk())
			TCU_THROW(InternalError, "failed to build program");

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly.");
		ctx.glGetProgramiv(graphicsPipelineProgram.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, &data[0]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glUseProgram(0);
	}
	ctx.endSection();
}